

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLUri.cpp
# Opt level: O2

void xercesc_4_0::XMLUri::isConformantUserInfo(XMLCh *userInfo,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  XMLSize_t XVar3;
  MalformedURLException *pMVar4;
  long lVar5;
  XMLCh *src;
  XMLCh local_38;
  undefined4 local_36;
  undefined2 local_32;
  
  if (userInfo != (XMLCh *)0x0) {
    for (src = userInfo; *src != L'\0'; src = (XMLCh *)((long)src + lVar5)) {
      bVar1 = isUnreservedCharacter(*src);
      lVar5 = 2;
      if (!bVar1) {
        iVar2 = XMLString::indexOf((XMLCh *)USERINFO_CHARACTERS,*src);
        if (iVar2 == -1) {
          if (*src != L'%') {
            pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x5b7,XMLNUM_URI_Component_Invalid_Char,(XMLCh *)errMsg_USERINFO,userInfo,
                       (XMLCh *)0x0,(XMLCh *)0x0,manager);
            __cxa_throw(pMVar4,&MalformedURLException::typeinfo,XMLException::~XMLException);
          }
          XVar3 = XMLString::stringLen(src);
          if (XVar3 < 3) {
LAB_0026a184:
            local_38 = L'%';
            local_36 = *(undefined4 *)(src + 1);
            local_32 = 0;
            pMVar4 = (MalformedURLException *)__cxa_allocate_exception(0x30);
            MalformedURLException::MalformedURLException
                      (pMVar4,
                       "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLUri.cpp"
                       ,0x5ae,XMLNUM_URI_Component_Invalid_EscapeSequence,(XMLCh *)errMsg_USERINFO,
                       &local_38,(XMLCh *)0x0,(XMLCh *)0x0,manager);
            __cxa_throw(pMVar4,&MalformedURLException::typeinfo,XMLException::~XMLException);
          }
          bVar1 = XMLString::isHex(src[1]);
          if (!bVar1) goto LAB_0026a184;
          bVar1 = XMLString::isHex(src[2]);
          lVar5 = 6;
          if (!bVar1) goto LAB_0026a184;
        }
      }
    }
  }
  return;
}

Assistant:

void XMLUri::isConformantUserInfo(const XMLCh* const userInfo
                                  , MemoryManager* const manager)
{
	if ( !userInfo )
        return;

    const XMLCh* tmpStr = userInfo;
    while (*tmpStr)
    {
        if ( isUnreservedCharacter(*tmpStr) ||
            (XMLString::indexOf(USERINFO_CHARACTERS, *tmpStr) != -1))
        {
            tmpStr++;
        }
        else if (*tmpStr == chPercent)               // '%'
        {
            if (XMLString::stringLen(tmpStr) >= 3
                && XMLString::isHex(*(tmpStr+1))     // 1st hex
                && XMLString::isHex(*(tmpStr+2))  )  // 2nd hex
            {
                tmpStr+=3;
            }
            else
            {
                XMLCh value1[4];
                value1[0] = chPercent;
                value1[1] = *(tmpStr+1);
                value1[2] = *(tmpStr+2);
                value1[3] = chNull;

                ThrowXMLwithMemMgr2(MalformedURLException
                        , XMLExcepts::XMLNUM_URI_Component_Invalid_EscapeSequence
                        , errMsg_USERINFO
                        , value1
                        , manager);
            }
        }
        else
        {
            ThrowXMLwithMemMgr2(MalformedURLException
                    , XMLExcepts::XMLNUM_URI_Component_Invalid_Char
                    , errMsg_USERINFO
                    , userInfo
                    , manager);
        }
    } //while

    return;
}